

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

void __thiscall gjkepa2_impl::EPA::Initialize(EPA *this)

{
  U UVar1;
  int iVar2;
  int iVar3;
  sFace *psVar4;
  long lVar5;
  sFace *psVar6;
  
  this->m_status = Failed;
  iVar3 = 0;
  this->m_nextsv = 0;
  this->m_depth = 0.0;
  psVar4 = this->m_fc_store + 0xff;
  lVar5 = 0x100;
  (this->m_normal).m_floats[0] = 0.0;
  (this->m_normal).m_floats[1] = 0.0;
  (this->m_normal).m_floats[2] = 0.0;
  (this->m_normal).m_floats[3] = 0.0;
  UVar1 = (this->m_stock).count;
  psVar6 = (this->m_stock).root;
  do {
    psVar4->l[0] = (sFace *)0x0;
    psVar4->l[1] = psVar6;
    if (psVar6 != (sFace *)0x0) {
      psVar6->l[0] = psVar4;
    }
    (this->m_stock).root = psVar4;
    psVar4 = psVar4 + -1;
    iVar2 = 0xff - iVar3;
    iVar3 = iVar3 + 1;
    psVar6 = (sFace *)((long)this->m_fc_store[0].n.m_floats + (ulong)(uint)(iVar2 * 0x60));
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  (this->m_stock).count = UVar1 + 0x100;
  return;
}

Assistant:

void Initialize()
	{
		m_status = eStatus::Failed;
		m_normal = cbtVector3(0, 0, 0);
		m_depth = 0;
		m_nextsv = 0;
		for (U i = 0; i < EPA_MAX_FACES; ++i)
		{
			append(m_stock, &m_fc_store[EPA_MAX_FACES - i - 1]);
		}
	}